

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_rope_f32(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  float *cache;
  float fVar1;
  float freq_scale;
  float ext_factor;
  float mscale;
  int32_t iVar2;
  int32_t iVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int32_t iVar10;
  int iVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  long ne0;
  long lVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  char *pcVar32;
  int iVar33;
  undefined8 *puVar34;
  undefined4 *puVar35;
  undefined8 uVar36;
  long lVar37;
  void *pvVar38;
  undefined4 *puVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float theta_scale;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float corr_dims [2];
  int sections [4];
  long local_208;
  long local_200;
  long local_1e8;
  float *local_1c0;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  float local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  size_t local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  size_t local_68;
  long local_60;
  long local_58;
  size_t local_50;
  undefined1 local_48 [16];
  
  pgVar12 = dst->src[0];
  pgVar13 = dst->src[1];
  pgVar14 = dst->src[2];
  iVar8 = dst->op_params[1];
  uVar47 = (ulong)iVar8;
  uVar9 = dst->op_params[2];
  iVar10 = dst->op_params[4];
  fVar1 = (float)dst->op_params[5];
  freq_scale = (float)dst->op_params[6];
  ext_factor = (float)dst->op_params[7];
  mscale = (float)dst->op_params[8];
  iVar2 = dst->op_params[9];
  iVar3 = dst->op_params[10];
  local_d8 = *(undefined8 *)(dst->op_params + 0xb);
  uStack_d0 = *(undefined8 *)(dst->op_params + 0xd);
  if (pgVar12->nb[0] == 4) {
    local_50 = pgVar12->nb[1];
    local_68 = pgVar12->nb[2];
    local_c0 = pgVar12->nb[3];
    ne0 = dst->ne[0];
    lVar15 = dst->ne[1];
    lVar16 = dst->ne[2];
    lVar17 = dst->ne[3];
    sVar18 = dst->nb[0];
    sVar19 = dst->nb[1];
    sVar20 = dst->nb[2];
    sVar21 = dst->nb[3];
    iVar11 = params->ith;
    iVar27 = params->nth;
    iVar26 = ggml_nrows(dst);
    if (ne0 < (long)uVar47) {
      pcVar32 = "n_dims <= ne0";
      uVar36 = 0x1406;
    }
    else if ((uVar47 & 1) == 0) {
      iVar27 = (iVar27 + -1 + iVar26) / iVar27;
      iVar33 = iVar27 * iVar11;
      iVar27 = iVar27 + iVar33;
      if (iVar26 <= iVar27) {
        iVar27 = iVar26;
      }
      theta_scale = powf(fVar1,-2.0 / (float)iVar8);
      ggml_rope_yarn_corr_dims(fVar1,iVar2,iVar3,iVar8,iVar10,local_e0);
      if (((((uVar9 & 8) == 0) || (0 < (int)local_d8)) || (0 < local_d8._4_4_)) ||
         (0 < (int)uStack_d0)) {
        if ((uVar9 == 0x18) && (ne0 / 2 != uVar47)) {
          pcVar32 = "n_dims == ne0/2";
          uVar36 = 0x1421;
        }
        else {
          if (pgVar14 == (ggml_tensor *)0x0) {
            local_1c0 = (float *)0x0;
LAB_0013f87e:
            if (0 < lVar17) {
              local_48 = ZEXT416((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
              pvVar22 = pgVar13->data;
              local_70 = (ne0 + 0x10) * (long)iVar11;
              local_88 = lVar16 * 0xc;
              local_78 = local_70 * 4 + 4;
              local_188 = (long)(iVar8 >> 1) << 2;
              local_138 = uVar47 * 4;
              local_120 = uVar47 * 4 + 4;
              local_80 = local_138 + 4 + local_70 * 4;
              local_118 = uVar47 * 2;
              local_110 = uVar47 * 6;
              local_128 = sVar18 * uVar47 + 4;
              local_150 = 0;
              local_178 = 4;
              local_190 = 0;
              iVar11 = 0;
              local_1e8 = 0;
              local_180 = local_138;
              local_170 = local_188;
              do {
                local_b8 = local_150;
                local_b0 = local_110;
                local_a8 = local_118;
                local_a0 = local_120;
                local_98 = local_128;
                local_90 = local_138;
                if (0 < lVar16) {
                  local_60 = local_1e8 * sVar21;
                  local_130 = local_178;
                  local_140 = local_180;
                  local_148 = local_170;
                  local_158 = local_188;
                  local_160 = local_190;
                  lVar31 = 0;
                  do {
                    pvVar23 = params->wdata;
                    cache = (float *)((long)pvVar23 + local_70 * 4);
                    iVar26 = *(int *)((long)pvVar22 + lVar31 * 4);
                    if ((uVar9 & 8) == 0) {
                      ggml_rope_cache_init
                                ((float)iVar26,freq_scale,local_1c0,local_e0,ne0,ext_factor,mscale,
                                 cache,local_48._0_4_,theta_scale);
                    }
                    else {
                      ggml_mrope_cache_init
                                ((float)iVar26,
                                 (float)*(int *)((long)pvVar22 + lVar16 * 4 + lVar31 * 4),
                                 (float)*(int *)((long)pvVar22 + lVar16 * 8 + lVar31 * 4),
                                 (float)*(int *)((long)pvVar22 + local_88 + lVar31 * 4),
                                 (int *)&local_d8,uVar9 == 0x18,freq_scale,local_1c0,local_e0,ne0,
                                 ext_factor,mscale,cache,local_48._0_4_,theta_scale);
                    }
                    auVar25 = _DAT_00155a80;
                    if (0 < lVar15) {
                      local_58 = lVar31 * sVar20;
                      iVar28 = iVar11 + (int)lVar15;
                      local_200 = local_110;
                      local_208 = local_118;
                      local_e8 = local_120;
                      local_f0 = local_128;
                      local_f8 = local_130;
                      local_100 = local_138;
                      lVar37 = 0;
                      lVar29 = local_148;
                      lVar30 = local_140;
                      lVar44 = local_158;
                      lVar45 = local_160;
                      lVar46 = local_150;
                      iVar26 = iVar11;
                      do {
                        if (iVar33 <= iVar26) {
                          iVar11 = iVar26 + 1;
                          if (iVar27 <= iVar26) break;
                          if ((uVar9 & 10) == 0) {
                            if (0 < iVar8) {
                              puVar34 = (undefined8 *)((long)dst->data + lVar45);
                              pvVar24 = pgVar12->data;
                              lVar40 = 0;
                              do {
                                uVar6 = *(uint *)((long)pvVar24 + lVar40 * 4 + local_f8);
                                auVar48._0_4_ = uVar6 ^ 0x80000000;
                                auVar48._4_4_ = 0x80000000;
                                auVar48._8_4_ = 0x80000000;
                                auVar48._12_4_ = 0x80000000;
                                auVar51._8_8_ = 0;
                                auVar51._0_8_ = *(ulong *)(cache + lVar40);
                                auVar48 = vpermt2ps_avx512vl(ZEXT416(uVar6),auVar25,auVar48);
                                auVar49 = vshufps_avx(auVar51,auVar51,0xe1);
                                auVar50._0_4_ = auVar49._0_4_ * auVar48._0_4_;
                                auVar50._4_4_ = auVar49._4_4_ * auVar48._4_4_;
                                auVar50._8_4_ = auVar49._8_4_ * auVar48._8_4_;
                                auVar50._12_4_ = auVar49._12_4_ * auVar48._12_4_;
                                uVar7 = *(undefined4 *)((long)pvVar24 + lVar40 * 4 + local_f8 + -4);
                                auVar49._4_4_ = uVar7;
                                auVar49._0_4_ = uVar7;
                                auVar49._8_4_ = uVar7;
                                auVar49._12_4_ = uVar7;
                                auVar49 = vfmadd231ps_avx512vl(auVar50,auVar51,auVar49);
                                uVar36 = vmovlps_avx(auVar49);
                                *puVar34 = uVar36;
                                lVar40 = lVar40 + 2;
                                puVar34 = (undefined8 *)((long)puVar34 + sVar18 * 2);
                              } while (lVar40 < (long)uVar47);
                            }
                          }
                          else if (uVar9 == 0x18) {
                            if (0 < iVar8) {
                              pvVar24 = pgVar12->data;
                              pvVar38 = dst->data;
                              lVar40 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar23 + lVar40 * 4 + local_78 + -4);
                                fVar4 = *(float *)((long)pvVar23 + lVar40 * 4 + local_78);
                                fVar5 = *(float *)((long)pvVar24 + lVar40 * 2 + local_100);
                                auVar48 = ZEXT416(*(uint *)((long)pvVar24 + lVar40 * 2 + lVar46));
                                auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),auVar48,
                                                          ZEXT416((uint)fVar1));
                                *(int *)((long)pvVar38 + lVar45) = auVar49._0_4_;
                                auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),auVar48,
                                                          ZEXT416((uint)fVar4));
                                *(int *)((long)pvVar38 + lVar30) = auVar49._0_4_;
                                lVar40 = lVar40 + 2;
                                pvVar38 = (void *)((long)pvVar38 + sVar18);
                              } while (lVar40 < (long)uVar47);
                            }
                          }
                          else if (0 < iVar8) {
                            pvVar24 = pgVar12->data;
                            pvVar38 = dst->data;
                            lVar40 = 0;
                            do {
                              fVar1 = *(float *)((long)pvVar23 + lVar40 * 4 + local_78 + -4);
                              fVar4 = *(float *)((long)pvVar23 + lVar40 * 4 + local_78);
                              fVar5 = *(float *)((long)pvVar24 + lVar40 * 2 + lVar29);
                              auVar48 = ZEXT416(*(uint *)((long)pvVar24 + lVar40 * 2 + lVar46));
                              auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),auVar48,
                                                        ZEXT416((uint)fVar1));
                              *(int *)((long)pvVar38 + lVar45) = auVar49._0_4_;
                              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),auVar48,
                                                        ZEXT416((uint)fVar4));
                              *(int *)((long)pvVar38 + lVar44) = auVar49._0_4_;
                              lVar40 = lVar40 + 2;
                              pvVar38 = (void *)((long)pvVar38 + sVar18);
                            } while (lVar40 < (long)uVar47);
                          }
                          if (uVar9 == 0x18) {
                            if ((long)uVar47 < ne0) {
                              pvVar24 = pgVar12->data;
                              pvVar38 = dst->data;
                              lVar40 = lVar37 * sVar19 + local_58 + local_60;
                              lVar41 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar23 + lVar41 * 4 + local_80 + -4);
                                fVar4 = *(float *)((long)pvVar23 + lVar41 * 4 + local_80);
                                lVar43 = ((long)(uVar47 + lVar41) >> 1) * sVar18;
                                fVar5 = *(float *)((long)pvVar24 + lVar41 * 2 + local_200);
                                auVar48 = ZEXT416(*(uint *)((long)pvVar24 + lVar41 * 2 + local_208))
                                ;
                                auVar49 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),auVar48,
                                                          ZEXT416((uint)fVar1));
                                *(int *)((long)pvVar38 + lVar43 + lVar40) = auVar49._0_4_;
                                auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar5)),auVar48,
                                                          ZEXT416((uint)fVar4));
                                *(int *)((long)pvVar38 + uVar47 * 4 + lVar43 + lVar40) =
                                     auVar49._0_4_;
                                lVar43 = uVar47 + 2 + lVar41;
                                lVar41 = lVar41 + 2;
                              } while (lVar43 < ne0);
                            }
                          }
                          else if ((long)uVar47 < ne0) {
                            puVar35 = (undefined4 *)((long)dst->data + local_f0);
                            puVar39 = (undefined4 *)((long)pgVar12->data + local_e8);
                            uVar42 = uVar47;
                            do {
                              puVar35[-1] = puVar39[-1];
                              *puVar35 = *puVar39;
                              uVar42 = uVar42 + 2;
                              puVar35 = (undefined4 *)((long)puVar35 + sVar18 * 2);
                              puVar39 = puVar39 + 2;
                            } while ((long)uVar42 < ne0);
                          }
                        }
                        lVar37 = lVar37 + 1;
                        lVar45 = lVar45 + sVar19;
                        lVar44 = lVar44 + sVar19;
                        lVar46 = lVar46 + local_50;
                        lVar29 = lVar29 + local_50;
                        lVar30 = lVar30 + sVar19;
                        local_100 = local_100 + local_50;
                        local_f8 = local_f8 + local_50;
                        local_f0 = local_f0 + sVar19;
                        local_e8 = local_e8 + local_50;
                        local_208 = local_208 + local_50;
                        local_200 = local_200 + local_50;
                        iVar26 = iVar26 + 1;
                        iVar11 = iVar28;
                      } while (lVar37 != lVar15);
                    }
                    lVar31 = lVar31 + 1;
                    local_160 = local_160 + sVar20;
                    local_158 = local_158 + sVar20;
                    local_150 = local_150 + local_68;
                    local_148 = local_148 + local_68;
                    local_140 = local_140 + sVar20;
                    local_138 = local_138 + local_68;
                    local_130 = local_130 + local_68;
                    local_128 = local_128 + sVar20;
                    local_120 = local_120 + local_68;
                    local_118 = local_118 + local_68;
                    local_110 = local_110 + local_68;
                  } while (lVar31 != lVar16);
                }
                local_1e8 = local_1e8 + 1;
                local_190 = local_190 + sVar21;
                local_188 = local_188 + sVar21;
                local_150 = local_b8 + local_c0;
                local_170 = local_170 + local_c0;
                local_180 = local_180 + sVar21;
                local_138 = local_90 + local_c0;
                local_178 = local_178 + local_c0;
                local_128 = local_98 + sVar21;
                local_120 = local_a0 + local_c0;
                local_118 = local_a8 + local_c0;
                local_110 = local_b0 + local_c0;
              } while (local_1e8 != lVar17);
            }
            return;
          }
          if (pgVar14->type == GGML_TYPE_F32) {
            if ((long)(iVar8 >> 1) <= pgVar14->ne[0]) {
              local_1c0 = (float *)pgVar14->data;
              goto LAB_0013f87e;
            }
            pcVar32 = "src2->ne[0] >= n_dims / 2";
            uVar36 = 0x1427;
          }
          else {
            pcVar32 = "src2->type == GGML_TYPE_F32";
            uVar36 = 0x1426;
          }
        }
      }
      else {
        pcVar32 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar36 = 0x141d;
      }
    }
    else {
      pcVar32 = "n_dims % 2 == 0";
      uVar36 = 0x1407;
    }
  }
  else {
    pcVar32 = "nb00 == sizeof(float)";
    uVar36 = 0x13ff;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar36,"GGML_ASSERT(%s) failed",pcVar32);
}

Assistant:

static void ggml_compute_forward_rope_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];

    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);

    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb00 == sizeof(float));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;  // ggml_rope_multi, multimodal rotary position embedding
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) { // batch
        for (int64_t i2 = 0; i2 < ne2; i2++) { // seq-len

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) { // attn-heads
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision){
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims];

                            dst_data[0]      = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims/2];

                            dst_data[0]        = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims/2] = x0*sin_theta + x1*cos_theta;
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = src[0];
                        const float x1 = src[1];

                        dst_data[0] = x0*cos_theta - x1*sin_theta;
                        dst_data[1] = x0*sin_theta + x1*cos_theta;
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = src[0];
                        const float x1 = src[n_dims];

                        dst_data[0]      = x0*cos_theta - x1*sin_theta;
                        dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                    }
                } else {
                    // fill the remain channels with data from src tensor
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}